

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::f64_Convert_i32s(w3Interp *this)

{
  int32_t *piVar1;
  
  piVar1 = w3Stack::i32(&this->super_w3Stack);
  w3Stack::set_f64(&this->super_w3Stack,(double)*piVar1);
  return;
}

Assistant:

INTERP (f64_Convert_i32s)
{
    set_f64 ((double)i32 ());
}